

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
               (teamscore *start,teamscore *end,_func_bool_teamscore_ptr_teamscore_ptr *fun)

{
  undefined1 auVar1 [16];
  bool bVar2;
  teamscore *ptVar3;
  undefined1 local_48 [8];
  teamscore pivot;
  teamscore *j;
  teamscore *i;
  teamscore *mid;
  _func_bool_teamscore_ptr_teamscore_ptr *fun_local;
  teamscore *end_local;
  teamscore *start_local;
  
  fun_local = (_func_bool_teamscore_ptr_teamscore_ptr *)end;
  end_local = start;
  do {
    if ((long)fun_local - (long)end_local >> 4 < 0xb) {
      insertionsort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
                (end_local,(teamscore *)fun_local,fun);
      return;
    }
    auVar1._8_8_ = (long)fun_local - (long)end_local >> 0x3f;
    auVar1._0_8_ = (long)fun_local - (long)end_local >> 4;
    ptVar3 = end_local + SUB168(auVar1 / SEXT816(2),0);
    j = end_local + 1;
    pivot._8_8_ = fun_local + -0x20;
    teamscore::teamscore((teamscore *)local_48);
    bVar2 = (*fun)(end_local,ptVar3);
    if (bVar2) {
      bVar2 = (*fun)((teamscore *)(fun_local + -0x10),end_local);
      if (bVar2) {
        local_48 = (undefined1  [8])end_local->team;
        pivot.team._0_4_ = end_local->score;
        end_local->team = *(char **)(fun_local + -0x10);
        end_local->score = *(int *)(fun_local + -8);
        *(char **)(fun_local + -0x10) = ptVar3->team;
        *(int *)(fun_local + -8) = ptVar3->score;
      }
      else {
        bVar2 = (*fun)((teamscore *)(fun_local + -0x10),ptVar3);
        if (bVar2) {
          local_48 = *(undefined1 (*) [8])(fun_local + -0x10);
          pivot.team._0_4_ = *(int *)(fun_local + -8);
          *(char **)(fun_local + -0x10) = ptVar3->team;
          *(int *)(fun_local + -8) = ptVar3->score;
        }
        else {
          local_48 = (undefined1  [8])ptVar3->team;
          pivot.team._0_4_ = ptVar3->score;
        }
      }
    }
    else {
      bVar2 = (*fun)(end_local,(teamscore *)(fun_local + -0x10));
      if (bVar2) {
        local_48 = (undefined1  [8])end_local->team;
        pivot.team._0_4_ = end_local->score;
        end_local->team = ptVar3->team;
        end_local->score = ptVar3->score;
      }
      else {
        bVar2 = (*fun)(ptVar3,(teamscore *)(fun_local + -0x10));
        if (bVar2) {
          local_48 = *(undefined1 (*) [8])(fun_local + -0x10);
          pivot.team._0_4_ = *(int *)(fun_local + -8);
          *(char **)(fun_local + -0x10) = end_local->team;
          *(int *)(fun_local + -8) = end_local->score;
          end_local->team = ptVar3->team;
          end_local->score = ptVar3->score;
        }
        else {
          local_48 = (undefined1  [8])ptVar3->team;
          pivot.team._0_4_ = ptVar3->score;
          swap<teamscore>(end_local,(teamscore *)(fun_local + -0x10));
        }
      }
    }
    ptVar3->team = *(char **)(fun_local + -0x20);
    ptVar3->score = *(int *)(fun_local + -0x18);
    do {
      while (bVar2 = (*fun)(j,(teamscore *)local_48), !bVar2) {
        while( true ) {
          pivot._8_8_ = pivot._8_8_ + -0x10;
          bVar2 = (*fun)((teamscore *)local_48,(teamscore *)pivot._8_8_);
          if (!bVar2) break;
          if ((ulong)pivot._8_8_ <= j) goto LAB_0016762e;
        }
        swap<teamscore>(j,(teamscore *)pivot._8_8_);
        j = j + 1;
        if ((ulong)pivot._8_8_ <= j) goto LAB_0016762e;
      }
      j = j + 1;
    } while (j < (ulong)pivot._8_8_);
LAB_0016762e:
    *(char **)(fun_local + -0x20) = j->team;
    *(int *)(fun_local + -0x18) = j->score;
    j->team = (char *)local_48;
    j->score = (int)pivot.team;
    if ((long)j - (long)end_local >> 4 < (long)fun_local - (long)(j + 1) >> 4) {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>(end_local,j,fun);
      end_local = j + 1;
    }
    else {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
                (j + 1,(teamscore *)fun_local,fun);
      fun_local = (_func_bool_teamscore_ptr_teamscore_ptr *)j;
    }
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}